

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv_sse2.c
# Opt level: O1

void SharpYuvFilterRow_SSE2
               (int16_t *A,int16_t *B,int len,uint16_t *best_y,uint16_t *out,int bit_depth)

{
  short *psVar1;
  short *psVar2;
  uint16_t *puVar3;
  short *psVar4;
  short *psVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  int iVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  int max_y;
  uint uVar20;
  uint16_t uVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  __m128i max;
  undefined1 auVar25 [16];
  short sVar26;
  short sVar31;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar39;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar38;
  undefined1 auVar30 [16];
  ushort uVar40;
  ushort uVar46;
  ushort uVar47;
  int iVar48;
  ushort uVar50;
  int iVar51;
  ushort uVar53;
  undefined1 in_XMM4 [16];
  ushort uVar49;
  ushort uVar52;
  ushort uVar54;
  undefined1 auVar41 [16];
  undefined1 auVar45 [16];
  ushort uVar55;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  undefined1 in_XMM5 [16];
  ushort uVar65;
  undefined1 auVar56 [16];
  short sVar66;
  int iVar67;
  short sVar74;
  short sVar75;
  int iVar76;
  short sVar77;
  short sVar78;
  int iVar79;
  short sVar80;
  short sVar81;
  short sVar83;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  int iVar82;
  short sVar84;
  short sVar86;
  int iVar85;
  short sVar87;
  short sVar89;
  int iVar88;
  short sVar90;
  short sVar92;
  int iVar91;
  short sVar93;
  short sVar95;
  int iVar94;
  undefined2 uVar32;
  undefined1 auVar44 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  
  uVar20 = ~(-1 << ((byte)bit_depth & 0x1f));
  auVar25 = pshuflw(ZEXT416(uVar20),ZEXT416(uVar20),0);
  uVar22 = 0;
  sVar8 = auVar25._2_2_;
  sVar9 = auVar25._0_2_;
  if (bit_depth < 0xb) {
    if (7 < len) {
      uVar23 = 0;
      do {
        psVar1 = A + uVar23;
        psVar4 = A + uVar23 + 1;
        psVar2 = B + uVar23;
        psVar5 = B + uVar23 + 1;
        sVar66 = *psVar5 + *psVar1;
        sVar74 = psVar5[1] + psVar1[1];
        sVar75 = psVar5[2] + psVar1[2];
        sVar77 = psVar5[3] + psVar1[3];
        sVar78 = psVar5[4] + psVar1[4];
        sVar80 = psVar5[5] + psVar1[5];
        sVar81 = psVar5[6] + psVar1[6];
        sVar83 = psVar5[7] + psVar1[7];
        sVar26 = *psVar2 + *psVar4;
        sVar31 = psVar2[1] + psVar4[1];
        sVar33 = psVar2[2] + psVar4[2];
        sVar34 = psVar2[3] + psVar4[3];
        sVar35 = psVar2[4] + psVar4[4];
        sVar36 = psVar2[5] + psVar4[5];
        sVar37 = psVar2[6] + psVar4[6];
        sVar39 = psVar2[7] + psVar4[7];
        sVar84 = sVar26 + sVar66 + 8;
        sVar86 = sVar31 + sVar74 + 8;
        sVar87 = sVar33 + sVar75 + 8;
        sVar89 = sVar34 + sVar77 + 8;
        sVar90 = sVar35 + sVar78 + 8;
        sVar92 = sVar36 + sVar80 + 8;
        sVar93 = sVar37 + sVar81 + 8;
        sVar95 = sVar39 + sVar83 + 8;
        auVar68._0_2_ = sVar66 * 2 + sVar84;
        auVar68._2_2_ = sVar74 * 2 + sVar86;
        auVar68._4_2_ = sVar75 * 2 + sVar87;
        auVar68._6_2_ = sVar77 * 2 + sVar89;
        auVar68._8_2_ = sVar78 * 2 + sVar90;
        auVar68._10_2_ = sVar80 * 2 + sVar92;
        auVar68._12_2_ = sVar81 * 2 + sVar93;
        auVar68._14_2_ = sVar83 * 2 + sVar95;
        auVar69 = psraw(auVar68,3);
        auVar27._0_2_ = sVar26 * 2 + sVar84;
        auVar27._2_2_ = sVar31 * 2 + sVar86;
        auVar27._4_2_ = sVar33 * 2 + sVar87;
        auVar27._6_2_ = sVar34 * 2 + sVar89;
        auVar27._8_2_ = sVar35 * 2 + sVar90;
        auVar27._10_2_ = sVar36 * 2 + sVar92;
        auVar27._12_2_ = sVar37 * 2 + sVar93;
        auVar27._14_2_ = sVar39 * 2 + sVar95;
        auVar25 = psraw(auVar27,3);
        auVar28._0_2_ = auVar25._0_2_ + *psVar1;
        auVar28._2_2_ = auVar25._2_2_ + psVar1[1];
        auVar28._4_2_ = auVar25._4_2_ + psVar1[2];
        auVar28._6_2_ = auVar25._6_2_ + psVar1[3];
        auVar28._8_2_ = auVar25._8_2_ + psVar1[4];
        auVar28._10_2_ = auVar25._10_2_ + psVar1[5];
        auVar28._12_2_ = auVar25._12_2_ + psVar1[6];
        auVar28._14_2_ = auVar25._14_2_ + psVar1[7];
        auVar70._0_2_ = auVar69._0_2_ + *psVar4;
        auVar70._2_2_ = auVar69._2_2_ + psVar4[1];
        auVar70._4_2_ = auVar69._4_2_ + psVar4[2];
        auVar70._6_2_ = auVar69._6_2_ + psVar4[3];
        auVar70._8_2_ = auVar69._8_2_ + psVar4[4];
        auVar70._10_2_ = auVar69._10_2_ + psVar4[5];
        auVar70._12_2_ = auVar69._12_2_ + psVar4[6];
        auVar70._14_2_ = auVar69._14_2_ + psVar4[7];
        auVar25 = psraw(auVar28,1);
        auVar69 = psraw(auVar70,1);
        puVar3 = best_y + uVar23 * 2;
        sVar66 = *puVar3 + auVar25._0_2_;
        sVar74 = puVar3[1] + auVar69._0_2_;
        sVar75 = puVar3[2] + auVar25._2_2_;
        sVar77 = puVar3[3] + auVar69._2_2_;
        sVar78 = puVar3[4] + auVar25._4_2_;
        sVar80 = puVar3[5] + auVar69._4_2_;
        sVar81 = puVar3[6] + auVar25._6_2_;
        sVar83 = puVar3[7] + auVar69._6_2_;
        puVar3 = best_y + uVar23 * 2 + 8;
        sVar26 = *puVar3 + auVar25._8_2_;
        sVar31 = puVar3[1] + auVar69._8_2_;
        sVar33 = puVar3[2] + auVar25._10_2_;
        sVar34 = puVar3[3] + auVar69._10_2_;
        sVar35 = puVar3[4] + auVar25._12_2_;
        sVar36 = puVar3[5] + auVar69._12_2_;
        sVar37 = puVar3[6] + auVar25._14_2_;
        sVar39 = puVar3[7] + auVar69._14_2_;
        uVar55 = (ushort)(sVar9 < sVar66) * sVar9 | (ushort)(sVar9 >= sVar66) * sVar66;
        uVar59 = (ushort)(sVar8 < sVar74) * sVar8 | (ushort)(sVar8 >= sVar74) * sVar74;
        uVar60 = (ushort)(sVar9 < sVar75) * sVar9 | (ushort)(sVar9 >= sVar75) * sVar75;
        uVar61 = (ushort)(sVar8 < sVar77) * sVar8 | (ushort)(sVar8 >= sVar77) * sVar77;
        uVar62 = (ushort)(sVar9 < sVar78) * sVar9 | (ushort)(sVar9 >= sVar78) * sVar78;
        uVar63 = (ushort)(sVar8 < sVar80) * sVar8 | (ushort)(sVar8 >= sVar80) * sVar80;
        uVar64 = (ushort)(sVar9 < sVar81) * sVar9 | (ushort)(sVar9 >= sVar81) * sVar81;
        uVar65 = (ushort)(sVar8 < sVar83) * sVar8 | (ushort)(sVar8 >= sVar83) * sVar83;
        uVar40 = (ushort)(sVar9 < sVar26) * sVar9 | (ushort)(sVar9 >= sVar26) * sVar26;
        uVar46 = (ushort)(sVar8 < sVar31) * sVar8 | (ushort)(sVar8 >= sVar31) * sVar31;
        uVar47 = (ushort)(sVar9 < sVar33) * sVar9 | (ushort)(sVar9 >= sVar33) * sVar33;
        uVar49 = (ushort)(sVar8 < sVar34) * sVar8 | (ushort)(sVar8 >= sVar34) * sVar34;
        uVar50 = (ushort)(sVar9 < sVar35) * sVar9 | (ushort)(sVar9 >= sVar35) * sVar35;
        uVar52 = (ushort)(sVar8 < sVar36) * sVar8 | (ushort)(sVar8 >= sVar36) * sVar36;
        uVar53 = (ushort)(sVar9 < sVar37) * sVar9 | (ushort)(sVar9 >= sVar37) * sVar37;
        uVar54 = (ushort)(sVar8 < sVar39) * sVar8 | (ushort)(sVar8 >= sVar39) * sVar39;
        puVar3 = out + uVar23 * 2;
        *puVar3 = (-1 < (short)uVar55) * uVar55;
        puVar3[1] = (-1 < (short)uVar59) * uVar59;
        puVar3[2] = (-1 < (short)uVar60) * uVar60;
        puVar3[3] = (-1 < (short)uVar61) * uVar61;
        puVar3[4] = (-1 < (short)uVar62) * uVar62;
        puVar3[5] = (-1 < (short)uVar63) * uVar63;
        puVar3[6] = (-1 < (short)uVar64) * uVar64;
        puVar3[7] = (-1 < (short)uVar65) * uVar65;
        puVar3 = out + uVar23 * 2 + 8;
        *puVar3 = (-1 < (short)uVar40) * uVar40;
        puVar3[1] = (-1 < (short)uVar46) * uVar46;
        puVar3[2] = (-1 < (short)uVar47) * uVar47;
        puVar3[3] = (-1 < (short)uVar49) * uVar49;
        puVar3[4] = (-1 < (short)uVar50) * uVar50;
        puVar3[5] = (-1 < (short)uVar52) * uVar52;
        puVar3[6] = (-1 < (short)uVar53) * uVar53;
        puVar3[7] = (-1 < (short)uVar54) * uVar54;
        uVar22 = uVar23 + 8;
        uVar18 = uVar23 + 0x10;
        uVar23 = uVar22;
      } while (uVar18 <= (uint)len);
    }
    if ((int)uVar22 < len) {
      uVar22 = uVar22 & 0xffffffff;
      lVar19 = 0;
      do {
        iVar14 = (int)B[uVar22 + lVar19 + 1] + (int)A[uVar22 + lVar19];
        sVar8 = A[uVar22 + lVar19 + 1];
        iVar24 = (int)B[uVar22 + lVar19] + (int)sVar8;
        iVar16 = iVar14 + iVar24 + 8;
        uVar17 = (uint)best_y[uVar22 * 2 + lVar19 * 2] +
                 (A[uVar22 + lVar19] * 8 + iVar24 * 2 + iVar16 >> 4);
        uVar15 = uVar20;
        if ((int)uVar17 < (int)uVar20) {
          uVar15 = uVar17;
        }
        uVar21 = (uint16_t)uVar15;
        if ((int)uVar17 < 0) {
          uVar21 = 0;
        }
        out[uVar22 * 2 + lVar19 * 2] = uVar21;
        uVar17 = (uint)best_y[uVar22 * 2 + lVar19 * 2 + 1] + (iVar14 * 2 + sVar8 * 8 + iVar16 >> 4);
        uVar15 = uVar17;
        if ((int)uVar20 <= (int)uVar17) {
          uVar15 = uVar20;
        }
        uVar21 = (uint16_t)uVar15;
        if ((int)uVar17 < 0) {
          uVar21 = 0;
        }
        out[uVar22 * 2 + lVar19 * 2 + 1] = uVar21;
        lVar19 = lVar19 + 1;
      } while ((uint)len - uVar22 != lVar19);
    }
  }
  else {
    if (3 < len) {
      uVar23 = 0;
      do {
        uVar6 = *(undefined8 *)(A + uVar23);
        auVar43._0_12_ = in_XMM4._0_12_;
        auVar43._12_2_ = in_XMM4._6_2_;
        auVar43._14_2_ = (short)((ulong)uVar6 >> 0x30);
        auVar42._12_4_ = auVar43._12_4_;
        auVar42._0_10_ = in_XMM4._0_10_;
        auVar42._10_2_ = (short)((ulong)uVar6 >> 0x20);
        auVar41._10_6_ = auVar42._10_6_;
        auVar41._0_8_ = in_XMM4._0_8_;
        auVar41._8_2_ = in_XMM4._4_2_;
        auVar10._4_8_ = auVar41._8_8_;
        auVar10._2_2_ = (short)((ulong)uVar6 >> 0x10);
        auVar10._0_2_ = in_XMM4._2_2_;
        iVar48 = auVar10._0_4_ >> 0x10;
        iVar51 = auVar41._8_4_ >> 0x10;
        uVar7 = *(undefined8 *)(A + uVar23 + 1);
        auVar58._0_12_ = in_XMM5._0_12_;
        auVar58._12_2_ = in_XMM5._6_2_;
        auVar58._14_2_ = (short)((ulong)uVar7 >> 0x30);
        auVar57._12_4_ = auVar58._12_4_;
        auVar57._0_10_ = in_XMM5._0_10_;
        auVar57._10_2_ = (short)((ulong)uVar7 >> 0x20);
        auVar56._10_6_ = auVar57._10_6_;
        auVar56._0_8_ = in_XMM5._0_8_;
        auVar56._8_2_ = in_XMM5._4_2_;
        auVar11._4_8_ = auVar56._8_8_;
        auVar11._2_2_ = (short)((ulong)uVar7 >> 0x10);
        auVar11._0_2_ = in_XMM5._2_2_;
        in_XMM5._0_4_ = (int)(short)uVar7;
        in_XMM5._4_4_ = auVar11._0_4_ >> 0x10;
        in_XMM5._8_4_ = auVar56._8_4_ >> 0x10;
        in_XMM5._12_4_ = auVar57._12_4_ >> 0x10;
        uVar22 = *(ulong *)(B + uVar23);
        uVar32 = (undefined2)(uVar22 >> 0x30);
        auVar29._8_4_ = 0;
        auVar29._0_8_ = uVar22;
        auVar29._12_2_ = uVar32;
        auVar29._14_2_ = uVar32;
        uVar32 = (undefined2)(uVar22 >> 0x20);
        auVar69._12_4_ = auVar29._12_4_;
        auVar69._8_2_ = 0;
        auVar69._0_8_ = uVar22;
        auVar69._10_2_ = uVar32;
        auVar25._10_6_ = auVar69._10_6_;
        auVar25._8_2_ = uVar32;
        auVar25._0_8_ = uVar22;
        uVar32 = (undefined2)(uVar22 >> 0x10);
        auVar12._4_8_ = auVar25._8_8_;
        auVar12._2_2_ = uVar32;
        auVar12._0_2_ = uVar32;
        uVar18 = *(ulong *)(B + uVar23 + 1);
        uVar32 = (undefined2)(uVar18 >> 0x30);
        auVar73._8_4_ = 0;
        auVar73._0_8_ = uVar18;
        auVar73._12_2_ = uVar32;
        auVar73._14_2_ = uVar32;
        uVar32 = (undefined2)(uVar18 >> 0x20);
        auVar72._12_4_ = auVar73._12_4_;
        auVar72._8_2_ = 0;
        auVar72._0_8_ = uVar18;
        auVar72._10_2_ = uVar32;
        auVar71._10_6_ = auVar72._10_6_;
        auVar71._8_2_ = uVar32;
        auVar71._0_8_ = uVar18;
        uVar32 = (undefined2)(uVar18 >> 0x10);
        auVar13._4_8_ = auVar71._8_8_;
        auVar13._2_2_ = uVar32;
        auVar13._0_2_ = uVar32;
        iVar67 = (int)(short)uVar18 + (int)(short)uVar6;
        iVar76 = (auVar13._0_4_ >> 0x10) + iVar48;
        iVar79 = (auVar71._8_4_ >> 0x10) + iVar51;
        iVar82 = (auVar72._12_4_ >> 0x10) + (auVar42._12_4_ >> 0x10);
        iVar14 = (short)uVar22 + in_XMM5._0_4_;
        iVar16 = (auVar12._0_4_ >> 0x10) + in_XMM5._4_4_;
        iVar24 = (auVar25._8_4_ >> 0x10) + in_XMM5._8_4_;
        iVar38 = (auVar69._12_4_ >> 0x10) + in_XMM5._12_4_;
        iVar85 = iVar14 + iVar67 + 8;
        iVar88 = iVar16 + iVar76 + 8;
        iVar91 = iVar24 + iVar79 + 8;
        iVar94 = iVar38 + iVar82 + 8;
        iVar14 = (iVar14 * 2 + iVar85 >> 3) + (int)(short)uVar6 >> 1;
        iVar16 = (iVar16 * 2 + iVar88 >> 3) + iVar48 >> 1;
        auVar45._4_4_ = iVar16;
        auVar45._0_4_ = iVar14;
        auVar45._8_4_ = iVar16;
        auVar45._12_4_ = (iVar76 * 2 + iVar88 >> 3) + in_XMM5._4_4_ >> 1;
        auVar44._8_8_ = auVar45._8_8_;
        auVar44._4_4_ = (iVar67 * 2 + iVar85 >> 3) + in_XMM5._0_4_ >> 1;
        auVar44._0_4_ = iVar14;
        auVar30._4_4_ = (iVar79 * 2 + iVar91 >> 3) + in_XMM5._8_4_ >> 1;
        auVar30._0_4_ = (iVar24 * 2 + iVar91 >> 3) + iVar51 >> 1;
        auVar30._8_4_ = (iVar38 * 2 + iVar94 >> 3) + (auVar42._12_4_ >> 0x10) >> 1;
        auVar30._12_4_ = (iVar82 * 2 + iVar94 >> 3) + in_XMM5._12_4_ >> 1;
        in_XMM4 = packssdw(auVar44,auVar30);
        puVar3 = best_y + uVar23 * 2;
        sVar26 = *puVar3 + in_XMM4._0_2_;
        sVar31 = puVar3[1] + in_XMM4._2_2_;
        sVar33 = puVar3[2] + in_XMM4._4_2_;
        sVar34 = puVar3[3] + in_XMM4._6_2_;
        sVar35 = puVar3[4] + in_XMM4._8_2_;
        sVar36 = puVar3[5] + in_XMM4._10_2_;
        sVar37 = puVar3[6] + in_XMM4._12_2_;
        sVar39 = puVar3[7] + in_XMM4._14_2_;
        uVar40 = (ushort)(sVar9 < sVar26) * sVar9 | (ushort)(sVar9 >= sVar26) * sVar26;
        uVar46 = (ushort)(sVar8 < sVar31) * sVar8 | (ushort)(sVar8 >= sVar31) * sVar31;
        uVar47 = (ushort)(sVar9 < sVar33) * sVar9 | (ushort)(sVar9 >= sVar33) * sVar33;
        uVar49 = (ushort)(sVar8 < sVar34) * sVar8 | (ushort)(sVar8 >= sVar34) * sVar34;
        uVar50 = (ushort)(sVar9 < sVar35) * sVar9 | (ushort)(sVar9 >= sVar35) * sVar35;
        uVar52 = (ushort)(sVar8 < sVar36) * sVar8 | (ushort)(sVar8 >= sVar36) * sVar36;
        uVar53 = (ushort)(sVar9 < sVar37) * sVar9 | (ushort)(sVar9 >= sVar37) * sVar37;
        uVar54 = (ushort)(sVar8 < sVar39) * sVar8 | (ushort)(sVar8 >= sVar39) * sVar39;
        puVar3 = out + uVar23 * 2;
        *puVar3 = (-1 < (short)uVar40) * uVar40;
        puVar3[1] = (-1 < (short)uVar46) * uVar46;
        puVar3[2] = (-1 < (short)uVar47) * uVar47;
        puVar3[3] = (-1 < (short)uVar49) * uVar49;
        puVar3[4] = (-1 < (short)uVar50) * uVar50;
        puVar3[5] = (-1 < (short)uVar52) * uVar52;
        puVar3[6] = (-1 < (short)uVar53) * uVar53;
        puVar3[7] = (-1 < (short)uVar54) * uVar54;
        uVar22 = uVar23 + 4;
        uVar18 = uVar23 + 8;
        uVar23 = uVar22;
      } while (uVar18 <= (uint)len);
    }
    if ((int)uVar22 < len) {
      uVar22 = uVar22 & 0xffffffff;
      lVar19 = 0;
      do {
        iVar14 = (int)B[uVar22 + lVar19 + 1] + (int)A[uVar22 + lVar19];
        sVar8 = A[uVar22 + lVar19 + 1];
        iVar24 = (int)B[uVar22 + lVar19] + (int)sVar8;
        iVar16 = iVar14 + iVar24 + 8;
        uVar17 = (uint)best_y[uVar22 * 2 + lVar19 * 2] +
                 (A[uVar22 + lVar19] * 8 + iVar24 * 2 + iVar16 >> 4);
        uVar15 = uVar20;
        if ((int)uVar17 < (int)uVar20) {
          uVar15 = uVar17;
        }
        uVar21 = (uint16_t)uVar15;
        if ((int)uVar17 < 0) {
          uVar21 = 0;
        }
        out[uVar22 * 2 + lVar19 * 2] = uVar21;
        uVar17 = (uint)best_y[uVar22 * 2 + lVar19 * 2 + 1] + (iVar14 * 2 + sVar8 * 8 + iVar16 >> 4);
        uVar15 = uVar17;
        if ((int)uVar20 <= (int)uVar17) {
          uVar15 = uVar20;
        }
        uVar21 = (uint16_t)uVar15;
        if ((int)uVar17 < 0) {
          uVar21 = 0;
        }
        out[uVar22 * 2 + lVar19 * 2 + 1] = uVar21;
        lVar19 = lVar19 + 1;
      } while ((uint)len - uVar22 != lVar19);
    }
  }
  return;
}

Assistant:

static void SharpYuvFilterRow_SSE2(const int16_t* A, const int16_t* B, int len,
                                   const uint16_t* best_y, uint16_t* out,
                                   int bit_depth) {
  if (bit_depth <= 10) {
    SharpYuvFilterRow16_SSE2(A, B, len, best_y, out, bit_depth);
  } else {
    SharpYuvFilterRow32_SSE2(A, B, len, best_y, out, bit_depth);
  }
}